

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O0

void replaceFormatNameInFieldList(FMStructDescList l,char *orig,char *repl,int repl_size)

{
  char *__s;
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  char *__dest;
  undefined8 *puVar5;
  undefined4 in_ECX;
  undefined8 *puVar6;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  int index;
  char *new;
  char *old;
  char *loc;
  int j;
  int i;
  int local_24;
  int local_20;
  
  local_20 = 0;
  while (*(long *)(in_RDI + (long)local_20 * 0x20) != 0) {
    local_24 = 0;
    while (*(long *)(*(long *)(in_RDI + (long)local_20 * 0x20 + 8) + (long)local_24 * 0x18) != 0) {
      pcVar1 = strstr(*(char **)(*(long *)(in_RDI + (long)local_20 * 0x20 + 8) +
                                 (long)local_24 * 0x18 + 8),in_RSI);
      if (pcVar1 != (char *)0x0) {
        if (in_RDX == (char *)0x0) {
          free(*(void **)(*(long *)(in_RDI + (long)local_20 * 0x20 + 8) + (long)local_24 * 0x18));
          free(*(void **)(*(long *)(in_RDI + (long)local_20 * 0x20 + 8) + (long)local_24 * 0x18 + 8)
              );
          while (*(long *)(*(long *)(in_RDI + (long)local_20 * 0x20 + 8) + (long)local_24 * 0x18) !=
                 0) {
            puVar5 = (undefined8 *)
                     (*(long *)(in_RDI + (long)local_20 * 0x20 + 8) + (long)local_24 * 0x18);
            puVar6 = (undefined8 *)
                     (*(long *)(in_RDI + (long)local_20 * 0x20 + 8) + (long)(local_24 + 1) * 0x18);
            *puVar5 = *puVar6;
            puVar5[1] = puVar6[1];
            puVar5[2] = puVar6[2];
          }
          local_24 = local_24 + -1;
        }
        else {
          __s = *(char **)(*(long *)(in_RDI + (long)local_20 * 0x20 + 8) + (long)local_24 * 0x18 + 8
                          );
          sVar2 = strlen(__s);
          sVar3 = strlen(in_RSI);
          sVar4 = strlen(in_RDX);
          __dest = (char *)malloc((sVar2 - sVar3) + sVar4 + 1);
          strncpy(__dest,__s,(long)pcVar1 - (long)__s);
          __dest[(long)pcVar1 - (long)__s] = '\0';
          strcat(__dest,in_RDX);
          sVar2 = strlen(in_RSI);
          strcat(__dest,pcVar1 + sVar2);
          free(__s);
          *(char **)(*(long *)(in_RDI + (long)local_20 * 0x20 + 8) + (long)local_24 * 0x18 + 8) =
               __dest;
          *(undefined4 *)
           (*(long *)(in_RDI + (long)local_20 * 0x20 + 8) + (long)local_24 * 0x18 + 0x10) = in_ECX;
        }
      }
      local_24 = local_24 + 1;
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

static void replaceFormatNameInFieldList(FMStructDescList l, const char *orig, const char *repl,
                                         int repl_size)
{
    int i = 0;
    while (l[i].format_name)
    {
        int j = 0;
        while (l[i].field_list[j].field_name)
        {
            char *loc;
            if ((loc = strstr(l[i].field_list[j].field_type, orig)))
            {
                if (repl)
                {
                    /* replace 'orig' with 'repl' */
                    char *old = (char *)l[i].field_list[j].field_type;
                    char *new = malloc(strlen(old) - strlen(orig) + strlen(repl) + 1);
                    strncpy(new, old, loc - old);
                    new[loc - old] = 0;
                    strcat(new, repl);
                    strcat(new, loc + strlen(orig));
                    free(old);
                    l[i].field_list[j].field_type = new;
                    l[i].field_list[j].field_size = repl_size;
                }
                else
                {
                    /* remove list item with 'orig'  Move higher elements down 1
                     */
                    int index = j;
                    free((char *)l[i].field_list[j].field_name);
                    free((char *)l[i].field_list[j].field_type);
                    while (l[i].field_list[index].field_name != NULL)
                    {
                        l[i].field_list[index] = l[i].field_list[index + 1];
                    }
                    j--; /* we've replaced this element, make sure we process
                            the one we replaced it with */
                }
            }
            j++;
        }
        i++;
    }
}